

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

size_t __thiscall wallet::CWallet::KeypoolCountExternalKeys(CWallet *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  LegacyScriptPubKeyMan *pLVar4;
  reference ppVar5;
  _Self *in_RDI;
  long in_FS_OFFSET;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *__range1;
  uint count;
  LegacyScriptPubKeyMan *legacy_spk_man;
  pair<const_OutputType,_wallet::ScriptPubKeyMan_*> spk_man;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  size_t local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (AnnotatedMixin<std::recursive_mutex> *)0xae6e14);
  pLVar4 = GetLegacyScriptPubKeyMan
                     ((CWallet *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pLVar4 == (LegacyScriptPubKeyMan *)0x0) {
    uVar6 = 0;
    std::
    map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::begin(in_stack_ffffffffffffffa0);
    std::
    map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::end(in_stack_ffffffffffffffa0);
    while( true ) {
      bVar2 = std::operator==(in_RDI,(_Self *)in_stack_ffffffffffffffa0);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>
                            *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar3 = (*ppVar5->second->_vptr_ScriptPubKeyMan[0x12])();
      uVar6 = iVar3 + uVar6;
      std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::
      operator++((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_> *
                 )CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    local_30 = (size_t)uVar6;
  }
  else {
    local_30 = LegacyScriptPubKeyMan::KeypoolCountExternalKeys
                         ((LegacyScriptPubKeyMan *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

size_t CWallet::KeypoolCountExternalKeys() const
{
    AssertLockHeld(cs_wallet);

    auto legacy_spk_man = GetLegacyScriptPubKeyMan();
    if (legacy_spk_man) {
        return legacy_spk_man->KeypoolCountExternalKeys();
    }

    unsigned int count = 0;
    for (auto spk_man : m_external_spk_managers) {
        count += spk_man.second->GetKeyPoolSize();
    }

    return count;
}